

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O3

cupdlp_dcs * cupdlp_dcs_transpose(cupdlp_dcs *A,int values)

{
  int *piVar1;
  uint m;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  double *pdVar6;
  cupdlp_dcs *A_00;
  void *__ptr;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  size_t __nmemb;
  
  if ((A != (cupdlp_dcs *)0x0) && (A->nz == -1)) {
    iVar11 = A->m;
    m = A->n;
    piVar2 = A->p;
    piVar3 = A->i;
    pdVar4 = A->x;
    A_00 = cupdlp_dcs_spalloc(m,iVar11,piVar2[(int)m],(uint)(pdVar4 != (double *)0x0 && values != 0)
                              ,0);
    __nmemb = (size_t)iVar11;
    __ptr = calloc(__nmemb,4);
    if (A_00 != (cupdlp_dcs *)0x0 && __ptr != (void *)0x0) {
      piVar5 = A_00->p;
      iVar12 = piVar2[(int)m];
      if (0 < (long)iVar12) {
        lVar7 = 0;
        do {
          piVar1 = (int *)((long)__ptr + (long)piVar3[lVar7] * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 1;
        } while (iVar12 != lVar7);
      }
      piVar1 = A_00->i;
      pdVar6 = A_00->x;
      if (piVar5 != (int *)0x0) {
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        else {
          sVar10 = 0;
          iVar12 = 0;
          do {
            piVar5[sVar10] = iVar12;
            iVar11 = *(int *)((long)__ptr + sVar10 * 4) + iVar12;
            *(int *)((long)__ptr + sVar10 * 4) = iVar12;
            sVar10 = sVar10 + 1;
            iVar12 = iVar11;
          } while (__nmemb != sVar10);
        }
        piVar5[__nmemb] = iVar11;
      }
      if (0 < (int)m) {
        iVar11 = *piVar2;
        uVar8 = 0;
        do {
          uVar9 = uVar8 + 1;
          iVar12 = piVar2[uVar8 + 1];
          if (iVar11 < piVar2[uVar8 + 1]) {
            lVar7 = (long)iVar11;
            do {
              lVar13 = (long)piVar3[lVar7];
              iVar11 = *(int *)((long)__ptr + lVar13 * 4);
              *(int *)((long)__ptr + lVar13 * 4) = iVar11 + 1;
              piVar1[iVar11] = (int)uVar8;
              if (pdVar6 != (double *)0x0) {
                pdVar6[iVar11] = pdVar4[lVar7];
              }
              lVar7 = lVar7 + 1;
              iVar12 = piVar2[uVar9];
            } while (lVar7 < piVar2[uVar9]);
          }
          iVar11 = iVar12;
          uVar8 = uVar9;
        } while (uVar9 != m);
      }
      free(__ptr);
      return A_00;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    cupdlp_dcs_spfree(A_00);
  }
  return (cupdlp_dcs *)0x0;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_transpose(const cupdlp_dcs *A, int values) {
  cupdlp_int p, q, j, *Cp, *Ci, n, m, *Ap, *Ai, *w;
  double *Cx, *Ax;
  cupdlp_dcs *C;
  if (!IS_CSC(A)) return (NULL); /* check inputs */
  m = A->m;
  n = A->n;
  Ap = A->p;
  Ai = A->i;
  Ax = A->x;
  C = cupdlp_dcs_spalloc(n, m, Ap[n], values && Ax, 0);  /* allocate result */
  w = cupdlp_calloc(m, sizeof(cupdlp_int));              /* get workspace */
  if (!C || !w) return (cupdlp_dcs_done(C, w, NULL, 0)); /* out of memory */
  Cp = C->p;
  Ci = C->i;
  Cx = C->x;
  for (p = 0; p < Ap[n]; p++) w[Ai[p]]++; /* row counts */
  cupdlp_dcs_cumsum(Cp, w, m);            /* row pointers */
  for (j = 0; j < n; j++) {
    for (p = Ap[j]; p < Ap[j + 1]; p++) {
      Ci[q = w[Ai[p]]++] = j; /* place A(i,j) as entry C(j,i) */
      if (Cx) Cx[q] = Ax[p];
    }
  }
  return (cupdlp_dcs_done(C, w, NULL, 1)); /* success; free w and return C */
}